

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O3

bool __thiscall
CriticalSectionsBuilder::buildCriticalSection(CriticalSectionsBuilder *this,LockNode *lock)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  CallInst *pCVar3;
  CriticalSection *this_00;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  CriticalSection *criticalSection;
  CriticalSection *local_68;
  _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
  local_60;
  
  pCVar3 = Node::callInstruction(&lock->super_Node);
  p_Var4 = (this->criticalSections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->criticalSections_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(CallInst **)(p_Var4 + 1) >= pCVar3) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(CallInst **)(p_Var4 + 1) < pCVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(CallInst **)(p_Var5 + 1) <= pCVar3)) {
      return false;
    }
  }
  this_00 = (CriticalSection *)operator_new(0x38);
  CriticalSection::CriticalSection(this_00,lock);
  local_68 = this_00;
  local_60._M_impl._0_8_ = Node::callInstruction(&lock->super_Node);
  std::
  _Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,CriticalSection*>,std::_Select1st<std::pair<llvm::CallInst_const*const,CriticalSection*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,CriticalSection*>>>
  ::_M_emplace_unique<llvm::CallInst_const*,CriticalSection*&>
            ((_Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,CriticalSection*>,std::_Select1st<std::pair<llvm::CallInst_const*const,CriticalSection*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,CriticalSection*>>>
              *)&this->criticalSections_,(CallInst **)&local_60,&local_68);
  this->currentLock = lock;
  LockNode::correspondingUnlocks
            ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)&local_60,
             lock);
  std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::operator=
            (&this->currentUnlocks,
             (set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)&local_60)
  ;
  std::
  _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  visitNode(this,&lock->super_Node);
  bVar2 = populateCriticalSection(this);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::_M_erase(&(this->examined_)._M_t,
             (_Link_type)(this->examined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this->examined_)._M_t._M_impl.super__Rb_tree_header;
  (this->examined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->examined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->examined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->examined_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return bVar2;
}

Assistant:

bool CriticalSectionsBuilder::buildCriticalSection(LockNode *lock) {
    auto iterator = criticalSections_.find(lock->callInstruction());
    if (iterator != criticalSections_.end()) {
        return false;
    }

    auto *criticalSection = new CriticalSection(lock);
    criticalSections_.emplace(lock->callInstruction(), criticalSection);

    currentLock = lock;
    currentUnlocks = lock->correspondingUnlocks();
    visitNode(lock);
    bool changed = populateCriticalSection();
    examined_.clear();
    return changed;
}